

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlnRetime.c
# Opt level: O0

void Wln_RetMarkChanges(Wln_Ret_t *p,Vec_Int_t *vFront)

{
  int iVar1;
  int local_1c;
  int iObj;
  int i;
  Vec_Int_t *vFront_local;
  Wln_Ret_t *p_local;
  
  if (vFront == (Vec_Int_t *)0x0) {
    iVar1 = Wln_NtkObjNum(p->pNtk);
    Vec_IntFill(&p->vPathDelays,iVar1,-1);
    for (local_1c = 0; iVar1 = Wln_NtkCiNum(p->pNtk), local_1c < iVar1; local_1c = local_1c + 1) {
      iVar1 = Wln_NtkCi(p->pNtk,local_1c);
      Vec_IntWriteEntry(&p->vPathDelays,iVar1,0);
    }
  }
  else {
    for (local_1c = 0; iVar1 = Vec_IntSize(vFront), local_1c < iVar1; local_1c = local_1c + 1) {
      iVar1 = Vec_IntEntry(vFront,local_1c);
      Wln_RetMarkChanges_rec(p,iVar1);
    }
  }
  return;
}

Assistant:

void Wln_RetMarkChanges( Wln_Ret_t * p, Vec_Int_t * vFront )
{
    int i, iObj;
    if ( vFront )
    {
        Vec_IntForEachEntry( vFront, iObj, i )
            Wln_RetMarkChanges_rec( p, iObj );
    }
    else
    {
        Vec_IntFill( &p->vPathDelays, Wln_NtkObjNum(p->pNtk), -1 );
        Wln_NtkForEachCi( p->pNtk, iObj, i )
            Vec_IntWriteEntry( &p->vPathDelays, iObj, 0 );
    }
}